

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

void Nwk_ManPrintFanioNew(Nwk_Man_t *pNtk)

{
  int *piVar1;
  ushort uVar2;
  void *pvVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint n;
  uint i;
  uint uVar7;
  uint n_00;
  ulong uVar8;
  double dVar9;
  double dVar10;
  int local_d0;
  int local_cc;
  char Buffer [100];
  
  n = 0;
  n_00 = 0;
  local_d0 = 0;
  local_cc = 0;
  for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(pNtk->vObjs,iVar5);
    if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x20) & 7) == 3)) {
      uVar7 = *(uint *)((long)pvVar3 + 0x3c);
      uVar6 = *(uint *)((long)pvVar3 + 0x40);
      local_d0 = local_d0 + uVar7;
      local_cc = local_cc + uVar6;
      if ((int)n <= (int)uVar7) {
        n = uVar7;
      }
      if ((int)n_00 <= (int)uVar6) {
        n_00 = uVar6;
      }
    }
  }
  iVar5 = Abc_Base10Log(n);
  uVar6 = iVar5 * 10 + 10;
  iVar5 = Abc_Base10Log(n_00);
  uVar7 = iVar5 * 10 + 10;
  if ((int)uVar7 < (int)uVar6) {
    uVar7 = uVar6;
  }
  p = Vec_IntStart(uVar7);
  p_00 = Vec_IntStart(uVar7);
  iVar5 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar5) {
      puts("The distribution of fanins and fanouts in the network:");
      puts("         Number   Nodes with fanin  Nodes with fanout");
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      uVar8 = 0;
      while( true ) {
        if (uVar7 == uVar8) break;
        piVar1 = p->pArray;
        if ((piVar1[uVar8] != 0) || (p_00->pArray[uVar8] != 0)) {
          if (uVar8 < 10) {
            printf("%15d : ",uVar8 & 0xffffffff);
          }
          else {
            iVar5 = (int)((uVar8 & 0xffffffff) / 10) * -10;
            dVar10 = (double)(int)((uVar8 & 0xffffffff) / 10);
            dVar9 = pow(10.0,dVar10);
            dVar10 = pow(10.0,dVar10);
            sprintf(Buffer,"%d - %d",(ulong)(uint)(((int)uVar8 + iVar5) * (int)dVar9),
                    (ulong)(((int)uVar8 + iVar5 + 1) * (int)dVar10 - 1));
            printf("%15s : ",Buffer);
          }
          if (piVar1[uVar8] == 0) {
            printf("              ");
          }
          else {
            printf("%12d  ");
          }
          printf("    ");
          if (p_00->pArray[uVar8] == 0) {
            printf("              ");
          }
          else {
            printf("%12d  ");
          }
          putchar(10);
        }
        uVar8 = uVar8 + 1;
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
      printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
             (double)local_d0 / (double)pNtk->nObjs[3],(double)local_cc / (double)pNtk->nObjs[3],
             (ulong)n,(ulong)n_00);
      return;
    }
    pvVar3 = Vec_PtrEntry(pNtk->vObjs,iVar5);
    if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x20) & 7) == 3)) {
      uVar6 = *(uint *)((long)pvVar3 + 0x3c);
      i = *(uint *)((long)pvVar3 + 0x40);
      uVar4 = extraout_EDX;
      if ((int)uVar6 < 10) {
LAB_003f6625:
        Vec_IntAddToEntry(p,uVar6,uVar4);
        uVar4 = extraout_EDX_00;
      }
      else {
        if (uVar6 < 100) {
          uVar6 = (uint)(byte)((char)(((ushort)uVar6 & 0xff) / 10) + 10);
          goto LAB_003f6625;
        }
        if (uVar6 < 1000) {
          uVar4 = (uVar6 & 0xffff) % 100;
          uVar2 = (short)((uVar6 & 0xffff) / 100) + 0x14;
LAB_003f6622:
          uVar6 = (uint)uVar2;
          goto LAB_003f6625;
        }
        if (uVar6 < 10000) {
          uVar4 = (uVar6 & 0xffff) % 1000;
          uVar2 = (short)((uVar6 & 0xffff) / 1000) + 0x1e;
          goto LAB_003f6622;
        }
        if (uVar6 < 100000) {
          uVar4 = uVar6 % 10000;
          uVar6 = uVar6 / 10000 + 0x28;
          goto LAB_003f6625;
        }
        if (uVar6 < 1000000) {
          uVar4 = uVar6 % 100000;
          uVar6 = uVar6 / 100000 + 0x32;
          goto LAB_003f6625;
        }
        if (uVar6 < 10000000) {
          uVar4 = uVar6 % 1000000;
          uVar6 = uVar6 / 1000000 + 0x3c;
          goto LAB_003f6625;
        }
      }
      if (9 < (int)i) {
        if (i < 100) {
          i = (uint)(byte)((char)(((ushort)i & 0xff) / 10) + 10);
        }
        else {
          if (i < 1000) {
            uVar4 = (i & 0xffff) % 100;
            uVar2 = (short)((i & 0xffff) / 100) + 0x14;
          }
          else {
            if (9999 < i) {
              if (i < 100000) {
                uVar4 = i % 10000;
                i = i / 10000 + 0x28;
              }
              else if (i < 1000000) {
                uVar4 = i % 100000;
                i = i / 100000 + 0x32;
              }
              else {
                if (9999999 < i) goto LAB_003f6681;
                uVar4 = i % 1000000;
                i = i / 1000000 + 0x3c;
              }
              goto LAB_003f6675;
            }
            uVar4 = (i & 0xffff) % 1000;
            uVar2 = (short)((i & 0xffff) / 1000) + 0x1e;
          }
          i = (uint)uVar2;
        }
      }
LAB_003f6675:
      Vec_IntAddToEntry(p_00,i,uVar4);
    }
LAB_003f6681:
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Nwk_ManPrintFanioNew( Nwk_Man_t * pNtk )
{
    char Buffer[100];
    Nwk_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        nFanins  = Nwk_ObjFaninNum(pNode);
        nFanouts = Nwk_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        nFanins  = Nwk_ObjFaninNum(pNode);
        nFanouts = Nwk_ObjFanoutNum(pNode);
//        nFanouts = Nwk_NodeMffcSize(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Nwk_ManNodeNum(pNtk), 
        nFanoutsMax, 1.0*nFanoutsAll/Nwk_ManNodeNum(pNtk)  );
}